

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefSite.h
# Opt level: O0

bool __thiscall
dg::dda::GenericDefSite<dg::dda::RWNode>::operator<
          (GenericDefSite<dg::dda::RWNode> *this,GenericDefSite<dg::dda::RWNode> *oth)

{
  bool bVar1;
  ulong *in_RSI;
  ulong *in_RDI;
  bool local_1a;
  bool local_19;
  
  if (*in_RDI == *in_RSI) {
    bVar1 = Offset::operator==((Offset *)(in_RDI + 1),(Offset *)(in_RSI + 1));
    if (bVar1) {
      local_19 = Offset::operator<((Offset *)(in_RDI + 2),(Offset *)(in_RSI + 2));
    }
    else {
      local_19 = Offset::operator<((Offset *)(in_RDI + 1),(Offset *)(in_RSI + 1));
    }
    local_1a = local_19;
  }
  else {
    local_1a = *in_RDI < *in_RSI;
  }
  return local_1a;
}

Assistant:

bool operator<(const GenericDefSite &oth) const {
        return target == oth.target
                       ? (offset == oth.offset ? len < oth.len
                                               : offset < oth.offset)
                       : target < oth.target;
    }